

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O1

void __thiscall
tinyjson::json_node::_serialize
          (json_node *this,int indent,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *iter,uint indent_size)

{
  long lVar1;
  double dVar2;
  byte bVar3;
  pointer ppjVar4;
  object *poVar5;
  _List_node_base *p_Var6;
  array *paVar7;
  array *paVar8;
  pointer ppjVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  size_t sVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  undefined8 unaff_RBP;
  long lVar18;
  char cVar19;
  byte bVar20;
  array *paVar21;
  pointer ppjVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  undefined1 *puVar26;
  size_t sVar27;
  bool bVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  char buf [32];
  double local_a8;
  undefined4 local_58;
  
  switch(this->type) {
  case null_type:
    pbVar10 = iter->container;
    uVar23 = 5;
    do {
      std::__cxx11::string::push_back((char)pbVar10);
      uVar23 = uVar23 - 1;
    } while (1 < uVar23);
    break;
  case boolean_type:
    cVar19 = (char)iter->container;
    if ((this->storage).bool_val == true) {
      uVar23 = 5;
      do {
        std::__cxx11::string::push_back(cVar19);
        uVar23 = uVar23 - 1;
      } while (1 < uVar23);
    }
    else {
      uVar23 = 6;
      do {
        std::__cxx11::string::push_back(cVar19);
        uVar23 = uVar23 - 1;
      } while (1 < uVar23);
    }
    break;
  case number_type:
    dVar2 = (this->storage).num_val;
    if (NAN(dVar2)) {
      local_58 = 0x6e616e;
    }
    else if (ABS(dVar2) == INFINITY) {
      local_58 = 0x666e69;
    }
    else if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar29 = -dVar2;
      uVar23 = CONCAT71((int7)((ulong)unaff_RBP >> 8),dVar2 < dVar29);
      local_a8 = dVar29;
      if (dVar29 <= dVar2) {
        local_a8 = dVar2;
      }
      dVar30 = log10(local_a8);
      iVar16 = (int)dVar30;
      bVar11 = 8 < iVar16;
      bVar28 = iVar16 - 0xeU < 0xffffffea;
      if (dVar29 <= dVar2) {
        pcVar25 = (char *)&local_58;
      }
      else {
        pcVar25 = (char *)((long)&local_58 + 1);
        local_58 = CONCAT31(local_58._1_3_,0x2d);
      }
      if (bVar28 || bVar11 && dVar2 < dVar29) {
        uVar17 = (iVar16 >> 0x1f) + iVar16;
        uVar23 = (ulong)uVar17;
        dVar30 = pow(10.0,(double)(int)uVar17);
        local_a8 = local_a8 / dVar30;
        iVar16 = 0;
      }
      iVar15 = 0;
      if (0 < iVar16) {
        iVar15 = iVar16;
      }
      do {
        dVar31 = pow(10.0,(double)iVar15);
        dVar30 = ABS(dVar31);
        if (((dVar30 != INFINITY && (dVar30 != 0.0 && (ulong)dVar30 < 0x7ff0000000000000)) &&
            (0xffffffffffffe < (long)dVar30 - 1U || -1 < (long)dVar31)) &&
            (0x3fe < (uint)((long)dVar30 + 0xfff0000000000000U >> 0x35) || -1 < (long)dVar31)) {
          dVar30 = floor(local_a8 / dVar31);
          local_a8 = local_a8 - (double)(int)dVar30 * dVar31;
          *pcVar25 = (char)(int)dVar30 + '0';
          pcVar25 = pcVar25 + 1;
        }
        iVar16 = iVar15 + -1;
        if ((iVar15 == 0) && (0.0 < local_a8)) {
          *pcVar25 = '.';
          pcVar25 = pcVar25 + 1;
        }
        bVar12 = 0 < iVar15;
        iVar15 = iVar16;
      } while ((bVar12) || (1e-14 < local_a8));
      if (bVar28 || bVar11 && dVar2 < dVar29) {
        *pcVar25 = 'e';
        if ((int)uVar23 < 1) {
          pcVar25[1] = '-';
          uVar23 = (ulong)(uint)-(int)uVar23;
        }
        else {
          pcVar25[1] = '+';
        }
        pcVar25 = pcVar25 + 2;
        uVar13 = 0;
        if (0 < (int)uVar23) {
          do {
            uVar17 = (uint)uVar23;
            pcVar25[uVar13] = (char)uVar23 + (char)((uVar23 & 0xffffffff) / 10) * -10 | 0x30;
            uVar13 = uVar13 + 1;
            uVar23 = (uVar23 & 0xffffffff) / 10;
          } while (9 < uVar17);
          pcVar25 = pcVar25 + uVar13;
        }
        if (1 < (int)uVar13) {
          uVar13 = uVar13 & 0xffffffff;
          lVar24 = 0;
          lVar18 = 0;
          do {
            bVar20 = pcVar25[lVar18 - uVar13];
            bVar3 = pcVar25[lVar24 + -1];
            pcVar25[lVar18 - uVar13] = bVar20 ^ bVar3;
            bVar20 = bVar20 ^ bVar3 ^ pcVar25[lVar24 + -1];
            pcVar25[lVar24 + -1] = bVar20;
            pcVar25[lVar18 - uVar13] = pcVar25[lVar18 - uVar13] ^ bVar20;
            lVar18 = lVar18 + 1;
            lVar1 = (uVar13 - 2) + lVar24;
            lVar24 = lVar24 + -1;
          } while (lVar18 < lVar1);
        }
      }
      *pcVar25 = '\0';
    }
    else {
      local_58 = CONCAT22(local_58._2_2_,0x30);
    }
    sVar14 = strlen((char *)&local_58);
    if (0 < (long)sVar14) {
      pbVar10 = iter->container;
      sVar27 = 0;
      do {
        std::__cxx11::string::push_back((char)pbVar10);
        sVar27 = sVar27 + 1;
      } while (sVar14 != sVar27);
    }
    break;
  case string_type:
    poVar5 = (this->storage).object_val;
    std::__cxx11::string::push_back((char)iter->container);
    p_Var6 = (poVar5->linked_list).
             super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    if (0 < (long)p_Var6) {
      pbVar10 = iter->container;
      puVar26 = (undefined1 *)((long)&p_Var6->_M_next + 1);
      do {
        std::__cxx11::string::push_back((char)pbVar10);
        puVar26 = (undefined1 *)((long)puVar26 + 0xffffffffffffffff);
      } while (1 < (long)puVar26);
    }
    cVar19 = (char)iter->container;
    goto LAB_00104374;
  case array_type:
    std::__cxx11::string::push_back((char)iter->container);
    iVar16 = -1;
    if (indent + 1 != 0) {
      iVar16 = indent + 1;
    }
    ppjVar9 = (((this->storage).array_val)->
              super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppjVar4 = (((this->storage).array_val)->
              super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppjVar9 != ppjVar4) {
      ppjVar22 = ppjVar9;
      do {
        if (ppjVar22 != ppjVar9) {
          std::__cxx11::string::push_back((char)iter->container);
        }
        if (iVar16 != -1) {
          std::__cxx11::string::push_back((char)iter->container);
          for (iVar15 = iVar16 * indent_size; iVar15 != 0; iVar15 = iVar15 + -1) {
            std::__cxx11::string::push_back((char)iter->container);
          }
        }
        _serialize(*ppjVar22,iVar16,iter,indent_size);
        ppjVar22 = ppjVar22 + 1;
      } while (ppjVar22 != ppjVar4);
    }
    if ((iVar16 != -1) &&
       ((((this->storage).array_val)->
        super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (((this->storage).array_val)->
        super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>)._M_impl.
        super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::push_back((char)iter->container);
      for (iVar16 = (iVar16 + -1) * indent_size; iVar16 != 0; iVar16 = iVar16 + -1) {
        std::__cxx11::string::push_back((char)iter->container);
      }
    }
    cVar19 = (char)iter->container;
    goto LAB_00104374;
  case object_type:
    std::__cxx11::string::push_back((char)iter->container);
    iVar16 = -1;
    if (indent + 1 != 0) {
      iVar16 = indent + 1;
    }
    paVar7 = (this->storage).array_val;
    paVar8 = (array *)(paVar7->
                      super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    if (paVar8 != paVar7) {
      paVar21 = paVar8;
      do {
        if (paVar21 != paVar8) {
          std::__cxx11::string::push_back((char)iter->container);
        }
        cVar19 = (char)iter->container;
        if (iVar16 == -1) {
          std::__cxx11::string::push_back(cVar19);
          ppjVar9 = paVar21[1].
                    super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (0 < (long)ppjVar9) {
            pbVar10 = iter->container;
            lVar24 = (long)ppjVar9 + 1;
            do {
              std::__cxx11::string::push_back((char)pbVar10);
              lVar24 = lVar24 + -1;
            } while (1 < lVar24);
          }
        }
        else {
          std::__cxx11::string::push_back(cVar19);
          for (iVar15 = iVar16 * indent_size; iVar15 != 0; iVar15 = iVar15 + -1) {
            std::__cxx11::string::push_back((char)iter->container);
          }
          std::__cxx11::string::push_back((char)iter->container);
          ppjVar9 = paVar21[1].
                    super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (0 < (long)ppjVar9) {
            pbVar10 = iter->container;
            lVar24 = (long)ppjVar9 + 1;
            do {
              std::__cxx11::string::push_back((char)pbVar10);
              lVar24 = lVar24 + -1;
            } while (1 < lVar24);
          }
          std::__cxx11::string::push_back((char)iter->container);
        }
        std::__cxx11::string::push_back((char)iter->container);
        std::__cxx11::string::push_back((char)iter->container);
        _serialize((json_node *)
                   paVar21[2].
                   super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,iVar16,iter,indent_size);
        paVar21 = (array *)(paVar21->
                           super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
      } while (paVar21 != paVar7);
    }
    if ((iVar16 != -1) &&
       ((array *)(((this->storage).array_val)->
                 super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
                 _M_impl.super__Vector_impl_data._M_start != (this->storage).array_val)) {
      std::__cxx11::string::push_back((char)iter->container);
      for (iVar16 = (iVar16 + -1) * indent_size; iVar16 != 0; iVar16 = iVar16 + -1) {
        std::__cxx11::string::push_back((char)iter->container);
      }
    }
    cVar19 = (char)iter->container;
LAB_00104374:
    std::__cxx11::string::push_back(cVar19);
    return;
  }
  return;
}

Assistant:

void _serialize(int indent, std::back_insert_iterator<string>& iter, unsigned int indent_size) const {
      switch (type) {
        case node_type::string_type:
          serialize_str(*(storage.str_val), iter);
          break;
        case node_type::object_type: {
          iter++ = '{';
          if (indent != -1) {
            ++indent;
          }
          auto cbegin = storage.object_val->cbegin();
          auto cend = storage.object_val->cend();
          for (auto citer = cbegin; citer != cend; ++citer) {
            if (citer != cbegin) {
              iter++ = ',';
            }
            if (indent != -1) {
              make_indent(indent, iter, indent_size);
            }
            serialize_str(citer->first, iter);
            iter++ = ':';
            if (indent != -1) {
              iter++ = ' ';
            }
            citer->second->_serialize(indent, iter, indent_size);
          }
          if (indent != -1) {
            --indent;
            if (!storage.object_val->empty()) {
              make_indent(indent, iter, indent_size);
            }
          }
          iter++ = '}';
          break;
        }
        case node_type::array_type: {
          iter++ = '[';
          if (indent != -1) {
            ++indent;
          }
          auto cbegin = storage.array_val->cbegin();
          auto cend = storage.array_val->cend();
          for (auto citer = cbegin; citer != cend; ++citer) {
            if (citer != cbegin) {
              iter++ = ',';
            }
            if (indent != -1) {
              make_indent(indent, iter, indent_size);
            }
            (*citer)->_serialize(indent, iter, indent_size);
          }
          if (indent != -1) {
            --indent;
            if (!storage.array_val->empty()) {
              make_indent(indent, iter, indent_size);
            }
          }
          iter++ = ']';
          break;
        }
        case node_type::null_type: {
		      static const char* n = "null";
          std::copy(n, n + 4, iter);
          break;
		    }
        case node_type::number_type: {
          char buf[MAX_NUMBER_STRING_SIZE];
          const char* c = dtoa(buf, storage.num_val);
          std::copy(c, c + strlen(c), iter);
          break;
        }
        case node_type::boolean_type: {
		      static const char* t = "true";
          static const char* f = "false";
          if (storage.bool_val) {
            std::copy(t, t + 4, iter);
          } else {
            std::copy(f, f + 5, iter);
          }
          break;
		    }
      }
    }